

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::predict(FastText *this,istream *in,int32_t k,bool print_prob)

{
  int iVar1;
  const_iterator it;
  pointer ppVar2;
  float fVar3;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  predictions;
  char local_5d;
  int32_t local_5c;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  FastText *local_38;
  
  local_58.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5c = k;
  local_38 = this;
  while( true ) {
    iVar1 = std::istream::peek();
    if (iVar1 == -1) break;
    predict(local_38,in,local_5c,&local_58);
    ppVar2 = local_58.
             super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_58.
        super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_58.
        super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"n/a",3);
    }
    else {
      for (; ppVar2 != local_58.
                       super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
        if (ppVar2 != local_58.
                      super__Vector_base<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          local_5d = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_5d,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(ppVar2->second)._M_dataplus._M_p,
                   (ppVar2->second)._M_string_length);
        if (print_prob) {
          local_5d = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_5d,1);
          fVar3 = expf(ppVar2->first);
          std::ostream::_M_insert<double>((double)fVar3);
        }
      }
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void FastText::predict(std::istream& in, int32_t k, bool print_prob) {
  std::vector<std::pair<real,std::string>> predictions;
  while (in.peek() != EOF) {
    predict(in, k, predictions);
    if (predictions.empty()) {
      std::cout << "n/a" << std::endl;
      continue;
    }
    for (auto it = predictions.cbegin(); it != predictions.cend(); it++) {
      if (it != predictions.cbegin()) {
        std::cout << ' ';
      }
      std::cout << it->second;
      if (print_prob) {
        std::cout << ' ' << exp(it->first);
      }
    }
    std::cout << std::endl;
  }
}